

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRenode(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_74;
  uint local_70;
  int fVerbose;
  int fUseMv;
  int fUseCnfs;
  int fUseSops;
  int fUseBdds;
  int fArea;
  int nAreaIters;
  int nFlowIters;
  int c;
  int nCutsMax;
  int nLutSize;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  c = 8;
  nFlowIters = 4;
  fArea = 1;
  fUseBdds = 1;
  fUseSops = 0;
  fUseCnfs = 0;
  fUseMv = 0;
  fVerbose = 0;
  local_70 = 0;
  local_74 = 0;
  Extra_UtilGetoptReset();
LAB_0022a293:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"KCFAabscivh");
    if (iVar1 == -1) {
      if (1 < fUseCnfs + fUseMv + fVerbose + local_70) {
        Abc_Print(-1,"Cannot optimize two parameters at the same time.\n");
        return 1;
      }
      if ((c < 2) || (0xf < c)) {
        Abc_Print(-1,"Incorrect LUT size (%d).\n",(ulong)(uint)c);
        return 1;
      }
      if ((nFlowIters < 1) || (0xfff < nFlowIters)) {
        Abc_Print(-1,"Incorrect number of cuts.\n");
        return 1;
      }
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"Cannot renode a network that is not an AIG (run \"strash\").\n");
        return 1;
      }
      pAVar2 = Abc_NtkRenode(pAVar2,c,nFlowIters,fArea,fUseBdds,fUseSops,fUseCnfs,fUseMv,fVerbose,
                             local_70,local_74);
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Renoding has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
    switch(iVar1) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by a positive integer.\n");
        goto LAB_0022a621;
      }
      fUseBdds = atoi(argv[globalUtilOptind]);
      iVar1 = fUseBdds;
      break;
    default:
      goto LAB_0022a621;
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0022a621;
      }
      nFlowIters = atoi(argv[globalUtilOptind]);
      iVar1 = nFlowIters;
      break;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by a positive integer.\n");
        goto LAB_0022a621;
      }
      fArea = atoi(argv[globalUtilOptind]);
      iVar1 = fArea;
      break;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0022a621;
      }
      c = atoi(argv[globalUtilOptind]);
      iVar1 = c;
      break;
    case 0x61:
      fUseSops = fUseSops ^ 1;
      goto LAB_0022a293;
    case 0x62:
      fUseCnfs = fUseCnfs ^ 1;
      goto LAB_0022a293;
    case 99:
      fVerbose = fVerbose ^ 1;
      goto LAB_0022a293;
    case 0x68:
      goto LAB_0022a621;
    case 0x69:
      local_70 = local_70 ^ 1;
      goto LAB_0022a293;
    case 0x73:
      fUseMv = fUseMv ^ 1;
      goto LAB_0022a293;
    case 0x76:
      local_74 = local_74 ^ 1;
      goto LAB_0022a293;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0022a621:
      Abc_Print(-2,"usage: renode [-KCFA <num>] [-sbciav]\n");
      Abc_Print(-2,"\t          transforms the AIG into a logic network with larger nodes\n");
      Abc_Print(-2,"\t          while minimizing the number of FF literals of the node SOPs\n");
      Abc_Print(-2,"\t-K <num>: the max cut size for renoding (2 < num < %d) [default = %d]\n",0x10,
                (ulong)(uint)c);
      Abc_Print(-2,
                "\t-C <num>: the max number of cuts used at a node (0 < num < 2^12) [default = %d]\n"
                ,(ulong)(uint)nFlowIters);
      Abc_Print(-2,
                "\t-F <num>: the number of area flow recovery iterations (num >= 0) [default = %d]\n"
                ,(ulong)(uint)fArea);
      Abc_Print(-2,
                "\t-A <num>: the number of exact area recovery iterations (num >= 0) [default = %d]\n"
                ,(ulong)(uint)fUseBdds);
      pcVar3 = "no";
      if (fUseMv != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s      : toggles minimizing SOP cubes instead of FF lits [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (fUseCnfs != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-b      : toggles minimizing BDD nodes instead of FF lits [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c      : toggles minimizing CNF clauses instead of FF lits [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (local_70 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-i      : toggles minimizing MV-SOP instead of FF lits [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (fUseSops != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-a      : toggles area-oriented mapping [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_74 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v      : print verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandRenode( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int nLutSize, nCutsMax, c;
    int nFlowIters, nAreaIters;
    int fArea;
    int fUseBdds;
    int fUseSops;
    int fUseCnfs;
    int fUseMv;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkRenode( Abc_Ntk_t * pNtk, int nLutSize, int nCutsMax, int nFlowIters, int nAreaIters, int fArea, int fUseBdds, int fUseSops, int fUseCnfs, int fUseMv, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    nLutSize   =  8;
    nCutsMax   =  4;
    nFlowIters =  1;
    nAreaIters =  1;
    fArea      =  0;
    fUseBdds   =  0;
    fUseSops   =  0;
    fUseCnfs   =  0;
    fUseMv     =  0;
    fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFAabscivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutsMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nFlowIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFlowIters < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nAreaIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nAreaIters < 0 )
                goto usage;
            break;
        case 'a':
            fArea ^= 1;
            break;
        case 'b':
            fUseBdds ^= 1;
            break;
        case 's':
            fUseSops ^= 1;
            break;
        case 'c':
            fUseCnfs ^= 1;
            break;
        case 'i':
            fUseMv ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( fUseBdds + fUseSops + fUseCnfs + fUseMv > 1 )
    {
        Abc_Print( -1, "Cannot optimize two parameters at the same time.\n" );
        return 1;
    }

    if ( nLutSize < 2 || nLutSize > IF_MAX_FUNC_LUTSIZE )
    {
        Abc_Print( -1, "Incorrect LUT size (%d).\n", nLutSize );
        return 1;
    }

    if ( nCutsMax < 1 || nCutsMax >= (1<<12) )
    {
        Abc_Print( -1, "Incorrect number of cuts.\n" );
        return 1;
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Cannot renode a network that is not an AIG (run \"strash\").\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkRenode( pNtk, nLutSize, nCutsMax, nFlowIters, nAreaIters, fArea, fUseBdds, fUseSops, fUseCnfs, fUseMv, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Renoding has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: renode [-KCFA <num>] [-sbciav]\n" );
    Abc_Print( -2, "\t          transforms the AIG into a logic network with larger nodes\n" );
    Abc_Print( -2, "\t          while minimizing the number of FF literals of the node SOPs\n" );
    Abc_Print( -2, "\t-K <num>: the max cut size for renoding (2 < num < %d) [default = %d]\n", IF_MAX_FUNC_LUTSIZE+1, nLutSize );
    Abc_Print( -2, "\t-C <num>: the max number of cuts used at a node (0 < num < 2^12) [default = %d]\n", nCutsMax );
    Abc_Print( -2, "\t-F <num>: the number of area flow recovery iterations (num >= 0) [default = %d]\n", nFlowIters );
    Abc_Print( -2, "\t-A <num>: the number of exact area recovery iterations (num >= 0) [default = %d]\n", nAreaIters );
    Abc_Print( -2, "\t-s      : toggles minimizing SOP cubes instead of FF lits [default = %s]\n", fUseSops? "yes": "no" );
    Abc_Print( -2, "\t-b      : toggles minimizing BDD nodes instead of FF lits [default = %s]\n", fUseBdds? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggles minimizing CNF clauses instead of FF lits [default = %s]\n", fUseCnfs? "yes": "no" );
    Abc_Print( -2, "\t-i      : toggles minimizing MV-SOP instead of FF lits [default = %s]\n", fUseMv? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggles area-oriented mapping [default = %s]\n", fArea? "yes": "no" );
    Abc_Print( -2, "\t-v      : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}